

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_int_pro_col_avx2
               (int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  uint in_R9D;
  __m128i results1_2;
  __m128i results0_2;
  __m256i result0_2;
  __m256i r012_2;
  __m256i r01_2;
  __m256i r3_2;
  __m256i r2_2;
  __m256i r1_2;
  __m256i r0_2;
  __m256i src_2 [4];
  int ht_2;
  __m256i zero_2;
  __m128i results1_1;
  __m128i results0_1;
  __m256i result0_1;
  __m256i r012_1;
  __m256i r01_1;
  __m256i r3_1;
  __m256i s7_1;
  __m256i s6_1;
  __m256i r2_1;
  __m256i s5_1;
  __m256i s4_1;
  __m256i r1_1;
  __m256i s3_1;
  __m256i s2_1;
  __m256i r0_1;
  __m256i s1_1;
  __m256i s0_1;
  __m256i src_1 [8];
  int ht_1;
  __m256i zero_1;
  __m128i results1;
  __m128i results0;
  __m256i result0;
  __m256i r012;
  __m256i r01;
  __m256i r3;
  __m256i s7;
  __m256i s6;
  __m256i r2;
  __m256i s5;
  __m256i s4;
  __m256i r1;
  __m256i s3;
  __m256i s2;
  __m256i r0;
  __m256i s1;
  __m256i s0;
  __m256i src [16];
  int ht;
  __m256i zero;
  undefined8 local_1900;
  undefined8 uStackY_18f8;
  undefined8 local_18e0;
  undefined8 uStackY_18d8;
  undefined8 uStackY_18d0;
  undefined8 uStackY_18c8;
  undefined8 local_18c0;
  undefined8 uStackY_18b8;
  undefined8 uStackY_18b0;
  undefined8 uStackY_18a8;
  undefined8 local_18a0;
  undefined8 uStackY_1898;
  undefined8 uStackY_1890;
  undefined8 uStackY_1888;
  undefined8 local_1820;
  undefined8 uStackY_1818;
  undefined8 uStackY_1810;
  undefined8 uStackY_1808;
  longlong local_1800;
  longlong lStackY_17f8;
  longlong lStackY_17f0;
  longlong lStackY_17e8;
  undefined8 local_17e0;
  undefined8 uStackY_17d8;
  undefined8 uStackY_17d0;
  undefined8 uStackY_17c8;
  undefined8 local_17c0;
  undefined8 uStackY_17b8;
  undefined8 uStackY_17b0;
  undefined8 uStackY_17a8;
  undefined8 local_17a0;
  undefined8 uStackY_1798;
  undefined8 uStackY_1790;
  undefined8 uStackY_1788;
  int local_1764;
  undefined8 local_1760;
  undefined8 uStackY_1758;
  undefined8 uStackY_1750;
  undefined8 uStackY_1748;
  undefined1 local_1740 [16];
  undefined1 local_1730 [16];
  undefined1 local_1720 [32];
  undefined8 local_1700;
  undefined8 uStackY_16f8;
  undefined8 uStackY_16f0;
  undefined1 local_16e0 [32];
  undefined8 uStack_16c8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  longlong local_1540;
  longlong lStack_1538;
  longlong lStack_1530;
  longlong lStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  longlong local_14c0;
  longlong lStack_14b8;
  longlong lStack_14b0;
  longlong lStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  int local_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  longlong local_1200;
  longlong lStack_11f8;
  longlong lStack_11f0;
  longlong lStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  longlong local_1180;
  longlong lStack_1178;
  longlong lStack_1170;
  longlong lStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  longlong local_1100;
  longlong lStack_10f8;
  longlong lStack_10f0;
  longlong lStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  longlong local_1080;
  longlong lStack_1078;
  longlong lStack_1070;
  longlong lStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  int local_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  uint local_fc0;
  int local_fbc;
  int local_fb4;
  uint8_t *local_fb0;
  undefined8 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [32];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [32];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined8 *local_c8;
  undefined1 local_c0 [16];
  undefined8 *local_a8;
  undefined1 local_a0 [16];
  undefined8 *local_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_40;
  undefined8 uStack_38;
  uint8_t *ref_00;
  int16_t *vbuf_00;
  
  local_fc0 = in_R9D;
  local_fbc = in_R8D;
  local_fb4 = in_EDX;
  local_fb0 = in_RSI;
  local_fa8 = in_RDI;
  if (in_ECX == 0x80) {
    local_920 = 0;
    uStack_918 = 0;
    uStack_910 = 0;
    uStack_908 = 0;
    local_fe0 = 0;
    uStack_fd8 = 0;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    for (local_fe4 = 0; local_fe4 < local_fbc; local_fe4 = local_fe4 + 4) {
      load_from_src_buf(local_fb0,(__m256i *)&local_1200,local_fb4);
      load_from_src_buf(local_fb0 + 0x20,(__m256i *)&local_1180,local_fb4);
      load_from_src_buf(local_fb0 + 0x40,(__m256i *)&local_1100,local_fb4);
      load_from_src_buf(local_fb0 + 0x60,(__m256i *)&local_1080,local_fb4);
      local_1e0 = local_fe0;
      uStack_1d8 = uStack_fd8;
      uStack_1d0 = uStack_fd0;
      uStack_1c8 = uStack_fc8;
      auVar57._8_8_ = lStack_11f8;
      auVar57._0_8_ = local_1200;
      auVar57._16_8_ = lStack_11f0;
      auVar57._24_8_ = lStack_11e8;
      auVar56._8_8_ = uStack_fd8;
      auVar56._0_8_ = local_fe0;
      auVar56._16_8_ = uStack_fd0;
      auVar56._24_8_ = uStack_fc8;
      local_980 = vpsadbw_avx2(auVar57,auVar56);
      local_220 = local_fe0;
      uStack_218 = uStack_fd8;
      uStack_210 = uStack_fd0;
      uStack_208 = uStack_fc8;
      auVar55._8_8_ = lStack_1178;
      auVar55._0_8_ = local_1180;
      auVar55._16_8_ = lStack_1170;
      auVar55._24_8_ = lStack_1168;
      auVar54._8_8_ = uStack_fd8;
      auVar54._0_8_ = local_fe0;
      auVar54._16_8_ = uStack_fd0;
      auVar54._24_8_ = uStack_fc8;
      local_9a0 = vpsadbw_avx2(auVar55,auVar54);
      local_1220 = vpaddw_avx2(local_980,local_9a0);
      local_260 = local_fe0;
      uStack_258 = uStack_fd8;
      uStack_250 = uStack_fd0;
      uStack_248 = uStack_fc8;
      auVar53._8_8_ = lStack_10f8;
      auVar53._0_8_ = local_1100;
      auVar53._16_8_ = lStack_10f0;
      auVar53._24_8_ = lStack_10e8;
      auVar52._8_8_ = uStack_fd8;
      auVar52._0_8_ = local_fe0;
      auVar52._16_8_ = uStack_fd0;
      auVar52._24_8_ = uStack_fc8;
      local_9c0 = vpsadbw_avx2(auVar53,auVar52);
      local_2a0 = local_fe0;
      uStack_298 = uStack_fd8;
      uStack_290 = uStack_fd0;
      uStack_288 = uStack_fc8;
      auVar51._8_8_ = lStack_1078;
      auVar51._0_8_ = local_1080;
      auVar51._16_8_ = lStack_1070;
      auVar51._24_8_ = lStack_1068;
      auVar50._8_8_ = uStack_fd8;
      auVar50._0_8_ = local_fe0;
      auVar50._16_8_ = uStack_fd0;
      auVar50._24_8_ = uStack_fc8;
      local_9e0 = vpsadbw_avx2(auVar51,auVar50);
      local_1240 = vpaddw_avx2(local_9c0,local_9e0);
      local_a00 = local_1220._0_8_;
      uStack_9f8 = local_1220._8_8_;
      uStack_9f0 = local_1220._16_8_;
      uStack_9e8 = local_1220._24_8_;
      local_a20 = local_1240._0_8_;
      uStack_a18 = local_1240._8_8_;
      uStack_a10 = local_1240._16_8_;
      uStack_a08 = local_1240._24_8_;
      local_1260 = vpaddw_avx2(local_1220,local_1240);
      local_2e0 = local_fe0;
      uStack_2d8 = uStack_fd8;
      uStack_2d0 = uStack_fd0;
      uStack_2c8 = uStack_fc8;
      auVar49._8_8_ = uStack_11d8;
      auVar49._0_8_ = local_11e0;
      auVar49._16_8_ = uStack_11d0;
      auVar49._24_8_ = uStack_11c8;
      auVar48._8_8_ = uStack_fd8;
      auVar48._0_8_ = local_fe0;
      auVar48._16_8_ = uStack_fd0;
      auVar48._24_8_ = uStack_fc8;
      local_a40 = vpsadbw_avx2(auVar49,auVar48);
      local_320 = local_fe0;
      uStack_318 = uStack_fd8;
      uStack_310 = uStack_fd0;
      uStack_308 = uStack_fc8;
      auVar47._8_8_ = uStack_1158;
      auVar47._0_8_ = local_1160;
      auVar47._16_8_ = uStack_1150;
      auVar47._24_8_ = uStack_1148;
      auVar46._8_8_ = uStack_fd8;
      auVar46._0_8_ = local_fe0;
      auVar46._16_8_ = uStack_fd0;
      auVar46._24_8_ = uStack_fc8;
      local_a60 = vpsadbw_avx2(auVar47,auVar46);
      local_1280 = vpaddw_avx2(local_a40,local_a60);
      local_360 = local_fe0;
      uStack_358 = uStack_fd8;
      uStack_350 = uStack_fd0;
      uStack_348 = uStack_fc8;
      auVar45._8_8_ = uStack_10d8;
      auVar45._0_8_ = local_10e0;
      auVar45._16_8_ = uStack_10d0;
      auVar45._24_8_ = uStack_10c8;
      auVar44._8_8_ = uStack_fd8;
      auVar44._0_8_ = local_fe0;
      auVar44._16_8_ = uStack_fd0;
      auVar44._24_8_ = uStack_fc8;
      local_a80 = vpsadbw_avx2(auVar45,auVar44);
      local_3a0 = local_fe0;
      uStack_398 = uStack_fd8;
      uStack_390 = uStack_fd0;
      uStack_388 = uStack_fc8;
      auVar43._8_8_ = uStack_1058;
      auVar43._0_8_ = local_1060;
      auVar43._16_8_ = uStack_1050;
      auVar43._24_8_ = uStack_1048;
      auVar42._8_8_ = uStack_fd8;
      auVar42._0_8_ = local_fe0;
      auVar42._16_8_ = uStack_fd0;
      auVar42._24_8_ = uStack_fc8;
      local_aa0 = vpsadbw_avx2(auVar43,auVar42);
      local_12a0 = vpaddw_avx2(local_a80,local_aa0);
      local_ac0 = local_1280._0_8_;
      uStack_ab8 = local_1280._8_8_;
      uStack_ab0 = local_1280._16_8_;
      uStack_aa8 = local_1280._24_8_;
      local_ae0 = local_12a0._0_8_;
      uStack_ad8 = local_12a0._8_8_;
      uStack_ad0 = local_12a0._16_8_;
      uStack_ac8 = local_12a0._24_8_;
      local_12c0 = vpaddw_avx2(local_1280,local_12a0);
      local_3e0 = local_fe0;
      uStack_3d8 = uStack_fd8;
      uStack_3d0 = uStack_fd0;
      uStack_3c8 = uStack_fc8;
      auVar41._8_8_ = uStack_11b8;
      auVar41._0_8_ = local_11c0;
      auVar41._16_8_ = uStack_11b0;
      auVar41._24_8_ = uStack_11a8;
      auVar40._8_8_ = uStack_fd8;
      auVar40._0_8_ = local_fe0;
      auVar40._16_8_ = uStack_fd0;
      auVar40._24_8_ = uStack_fc8;
      local_b00 = vpsadbw_avx2(auVar41,auVar40);
      local_420 = local_fe0;
      uStack_418 = uStack_fd8;
      uStack_410 = uStack_fd0;
      uStack_408 = uStack_fc8;
      auVar39._8_8_ = uStack_1138;
      auVar39._0_8_ = local_1140;
      auVar39._16_8_ = uStack_1130;
      auVar39._24_8_ = uStack_1128;
      auVar38._8_8_ = uStack_fd8;
      auVar38._0_8_ = local_fe0;
      auVar38._16_8_ = uStack_fd0;
      auVar38._24_8_ = uStack_fc8;
      local_b20 = vpsadbw_avx2(auVar39,auVar38);
      local_12e0 = vpaddw_avx2(local_b00,local_b20);
      local_460 = local_fe0;
      uStack_458 = uStack_fd8;
      uStack_450 = uStack_fd0;
      uStack_448 = uStack_fc8;
      auVar37._8_8_ = uStack_10b8;
      auVar37._0_8_ = local_10c0;
      auVar37._16_8_ = uStack_10b0;
      auVar37._24_8_ = uStack_10a8;
      auVar36._8_8_ = uStack_fd8;
      auVar36._0_8_ = local_fe0;
      auVar36._16_8_ = uStack_fd0;
      auVar36._24_8_ = uStack_fc8;
      local_b40 = vpsadbw_avx2(auVar37,auVar36);
      local_4a0 = local_fe0;
      uStack_498 = uStack_fd8;
      uStack_490 = uStack_fd0;
      uStack_488 = uStack_fc8;
      auVar35._8_8_ = uStack_1038;
      auVar35._0_8_ = local_1040;
      auVar35._16_8_ = uStack_1030;
      auVar35._24_8_ = uStack_1028;
      auVar34._8_8_ = uStack_fd8;
      auVar34._0_8_ = local_fe0;
      auVar34._16_8_ = uStack_fd0;
      auVar34._24_8_ = uStack_fc8;
      local_b60 = vpsadbw_avx2(auVar35,auVar34);
      local_1300 = vpaddw_avx2(local_b40,local_b60);
      local_b80 = local_12e0._0_8_;
      uStack_b78 = local_12e0._8_8_;
      uStack_b70 = local_12e0._16_8_;
      uStack_b68 = local_12e0._24_8_;
      local_ba0 = local_1300._0_8_;
      uStack_b98 = local_1300._8_8_;
      uStack_b90 = local_1300._16_8_;
      uStack_b88 = local_1300._24_8_;
      local_1320 = vpaddw_avx2(local_12e0,local_1300);
      local_4e0 = local_fe0;
      uStack_4d8 = uStack_fd8;
      uStack_4d0 = uStack_fd0;
      uStack_4c8 = uStack_fc8;
      auVar33._8_8_ = uStack_1198;
      auVar33._0_8_ = local_11a0;
      auVar33._16_8_ = uStack_1190;
      auVar33._24_8_ = uStack_1188;
      auVar32._8_8_ = uStack_fd8;
      auVar32._0_8_ = local_fe0;
      auVar32._16_8_ = uStack_fd0;
      auVar32._24_8_ = uStack_fc8;
      local_bc0 = vpsadbw_avx2(auVar33,auVar32);
      local_520 = local_fe0;
      uStack_518 = uStack_fd8;
      uStack_510 = uStack_fd0;
      uStack_508 = uStack_fc8;
      auVar31._8_8_ = uStack_1118;
      auVar31._0_8_ = local_1120;
      auVar31._16_8_ = uStack_1110;
      auVar31._24_8_ = uStack_1108;
      auVar30._8_8_ = uStack_fd8;
      auVar30._0_8_ = local_fe0;
      auVar30._16_8_ = uStack_fd0;
      auVar30._24_8_ = uStack_fc8;
      local_be0 = vpsadbw_avx2(auVar31,auVar30);
      local_1340 = vpaddw_avx2(local_bc0,local_be0);
      local_560 = local_fe0;
      uStack_558 = uStack_fd8;
      uStack_550 = uStack_fd0;
      uStack_548 = uStack_fc8;
      auVar29._8_8_ = uStack_1098;
      auVar29._0_8_ = local_10a0;
      auVar29._16_8_ = uStack_1090;
      auVar29._24_8_ = uStack_1088;
      auVar28._8_8_ = uStack_fd8;
      auVar28._0_8_ = local_fe0;
      auVar28._16_8_ = uStack_fd0;
      auVar28._24_8_ = uStack_fc8;
      local_c00 = vpsadbw_avx2(auVar29,auVar28);
      local_5a0 = local_fe0;
      uStack_598 = uStack_fd8;
      uStack_590 = uStack_fd0;
      uStack_588 = uStack_fc8;
      auVar27._8_8_ = uStack_1018;
      auVar27._0_8_ = local_1020;
      auVar27._16_8_ = uStack_1010;
      auVar27._24_8_ = uStack_1008;
      auVar26._8_8_ = uStack_fd8;
      auVar26._0_8_ = local_fe0;
      auVar26._16_8_ = uStack_fd0;
      auVar26._24_8_ = uStack_fc8;
      local_c20 = vpsadbw_avx2(auVar27,auVar26);
      local_1360 = vpaddw_avx2(local_c00,local_c20);
      local_c40 = local_1340._0_8_;
      uStack_c38 = local_1340._8_8_;
      uStack_c30 = local_1340._16_8_;
      uStack_c28 = local_1340._24_8_;
      local_c60 = local_1360._0_8_;
      uStack_c58 = local_1360._8_8_;
      uStack_c50 = local_1360._16_8_;
      uStack_c48 = local_1360._24_8_;
      local_1380 = vpaddw_avx2(local_1340,local_1360);
      local_c80 = vpslldq_avx2(local_12c0,2);
      local_ca0 = local_1260._0_8_;
      uStack_c98 = local_1260._8_8_;
      uStack_c90 = local_1260._16_8_;
      uStack_c88 = local_1260._24_8_;
      local_13a0 = vpaddw_avx2(local_c80,local_1260);
      local_cc0 = vpslldq_avx2(local_1320,4);
      local_ce0 = local_13a0._0_8_;
      uStack_cd8 = local_13a0._8_8_;
      uStack_cd0 = local_13a0._16_8_;
      uStack_cc8 = local_13a0._24_8_;
      local_13c0 = vpaddw_avx2(local_cc0,local_13a0);
      local_d00 = vpslldq_avx2(local_1380,6);
      local_d20 = local_13c0._0_8_;
      uStack_d18 = local_13c0._8_8_;
      uStack_d10 = local_13c0._16_8_;
      uStack_d08 = local_13c0._24_8_;
      local_13e0 = vpaddw_avx2(local_d00,local_13c0);
      local_8c0 = local_13e0._0_8_;
      uStack_8b8 = local_13e0._8_8_;
      uStack_8b0 = local_13e0._16_8_;
      uStack_8a8 = local_13e0._24_8_;
      local_f0 = local_13e0._0_8_;
      uStack_e8 = local_13e0._8_8_;
      local_100 = local_13e0._16_8_;
      uStack_f8 = local_13e0._24_8_;
      local_13f0 = vpaddw_avx(local_13e0._0_16_,local_13e0._16_16_);
      local_120 = vpsrldq_avx(local_13f0,8);
      local_1400 = vpaddw_avx(local_13f0,local_120);
      local_90 = local_fa8;
      local_40 = local_1400._0_8_;
      uStack_38 = local_1400._8_8_;
      local_a0 = vpsrlw_avx(local_1400,ZEXT416(local_fc0));
      *local_fa8 = local_a0._0_8_;
      local_fa8 = local_fa8 + 1;
      local_fb0 = local_fb0 + (local_fb4 << 2);
      local_110 = local_13f0;
    }
  }
  else if (in_ECX == 0x40) {
    local_940 = 0;
    uStack_938 = 0;
    uStack_930 = 0;
    uStack_928 = 0;
    local_1420 = 0;
    uStack_1418 = 0;
    uStack_1410 = 0;
    uStack_1408 = 0;
    for (local_1424 = 0; local_1424 < local_fbc; local_1424 = local_1424 + 4) {
      load_from_src_buf(local_fb0,(__m256i *)&local_1540,local_fb4);
      load_from_src_buf(local_fb0 + 0x20,(__m256i *)&local_14c0,local_fb4);
      local_5e0 = local_1420;
      uStack_5d8 = uStack_1418;
      uStack_5d0 = uStack_1410;
      uStack_5c8 = uStack_1408;
      auVar25._8_8_ = lStack_1538;
      auVar25._0_8_ = local_1540;
      auVar25._16_8_ = lStack_1530;
      auVar25._24_8_ = lStack_1528;
      auVar24._8_8_ = uStack_1418;
      auVar24._0_8_ = local_1420;
      auVar24._16_8_ = uStack_1410;
      auVar24._24_8_ = uStack_1408;
      auVar2 = vpsadbw_avx2(auVar25,auVar24);
      local_620 = local_1420;
      uStack_618 = uStack_1418;
      uStack_610 = uStack_1410;
      uStack_608 = uStack_1408;
      auVar23._8_8_ = lStack_14b8;
      auVar23._0_8_ = local_14c0;
      auVar23._16_8_ = lStack_14b0;
      auVar23._24_8_ = lStack_14a8;
      auVar22._8_8_ = uStack_1418;
      auVar22._0_8_ = local_1420;
      auVar22._16_8_ = uStack_1410;
      auVar22._24_8_ = uStack_1408;
      auVar3 = vpsadbw_avx2(auVar23,auVar22);
      local_1560 = auVar2._0_8_;
      local_d40 = local_1560;
      uStack_1558 = auVar2._8_8_;
      uStack_d38 = uStack_1558;
      uStack_1550 = auVar2._16_8_;
      uStack_d30 = uStack_1550;
      uStack_1548 = auVar2._24_8_;
      uStack_d28 = uStack_1548;
      local_1580 = auVar3._0_8_;
      local_d60 = local_1580;
      uStack_1578 = auVar3._8_8_;
      uStack_d58 = uStack_1578;
      uStack_1570 = auVar3._16_8_;
      uStack_d50 = uStack_1570;
      uStack_1568 = auVar3._24_8_;
      uStack_d48 = uStack_1568;
      auVar2 = vpaddw_avx2(auVar2,auVar3);
      local_660 = local_1420;
      uStack_658 = uStack_1418;
      uStack_650 = uStack_1410;
      uStack_648 = uStack_1408;
      auVar21._8_8_ = uStack_1518;
      auVar21._0_8_ = local_1520;
      auVar21._16_8_ = uStack_1510;
      auVar21._24_8_ = uStack_1508;
      auVar20._8_8_ = uStack_1418;
      auVar20._0_8_ = local_1420;
      auVar20._16_8_ = uStack_1410;
      auVar20._24_8_ = uStack_1408;
      auVar3 = vpsadbw_avx2(auVar21,auVar20);
      local_6a0 = local_1420;
      uStack_698 = uStack_1418;
      uStack_690 = uStack_1410;
      uStack_688 = uStack_1408;
      auVar19._8_8_ = uStack_1498;
      auVar19._0_8_ = local_14a0;
      auVar19._16_8_ = uStack_1490;
      auVar19._24_8_ = uStack_1488;
      auVar18._8_8_ = uStack_1418;
      auVar18._0_8_ = local_1420;
      auVar18._16_8_ = uStack_1410;
      auVar18._24_8_ = uStack_1408;
      auVar4 = vpsadbw_avx2(auVar19,auVar18);
      local_15c0 = auVar3._0_8_;
      local_d80 = local_15c0;
      uStack_15b8 = auVar3._8_8_;
      uStack_d78 = uStack_15b8;
      uStack_15b0 = auVar3._16_8_;
      uStack_d70 = uStack_15b0;
      uStack_15a8 = auVar3._24_8_;
      uStack_d68 = uStack_15a8;
      local_15e0 = auVar4._0_8_;
      local_da0 = local_15e0;
      uStack_15d8 = auVar4._8_8_;
      uStack_d98 = uStack_15d8;
      uStack_15d0 = auVar4._16_8_;
      uStack_d90 = uStack_15d0;
      uStack_15c8 = auVar4._24_8_;
      uStack_d88 = uStack_15c8;
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      local_6e0 = local_1420;
      uStack_6d8 = uStack_1418;
      uStack_6d0 = uStack_1410;
      uStack_6c8 = uStack_1408;
      auVar17._8_8_ = uStack_14f8;
      auVar17._0_8_ = local_1500;
      auVar17._16_8_ = uStack_14f0;
      auVar17._24_8_ = uStack_14e8;
      auVar16._8_8_ = uStack_1418;
      auVar16._0_8_ = local_1420;
      auVar16._16_8_ = uStack_1410;
      auVar16._24_8_ = uStack_1408;
      auVar4 = vpsadbw_avx2(auVar17,auVar16);
      local_720 = local_1420;
      uStack_718 = uStack_1418;
      uStack_710 = uStack_1410;
      uStack_708 = uStack_1408;
      auVar15._8_8_ = uStack_1478;
      auVar15._0_8_ = local_1480;
      auVar15._16_8_ = uStack_1470;
      auVar15._24_8_ = uStack_1468;
      auVar14._8_8_ = uStack_1418;
      auVar14._0_8_ = local_1420;
      auVar14._16_8_ = uStack_1410;
      auVar14._24_8_ = uStack_1408;
      auVar5 = vpsadbw_avx2(auVar15,auVar14);
      local_1620 = auVar4._0_8_;
      local_dc0 = local_1620;
      uStack_1618 = auVar4._8_8_;
      uStack_db8 = uStack_1618;
      uStack_1610 = auVar4._16_8_;
      uStack_db0 = uStack_1610;
      uStack_1608 = auVar4._24_8_;
      uStack_da8 = uStack_1608;
      local_1640 = auVar5._0_8_;
      local_de0 = local_1640;
      uStack_1638 = auVar5._8_8_;
      uStack_dd8 = uStack_1638;
      uStack_1630 = auVar5._16_8_;
      uStack_dd0 = uStack_1630;
      uStack_1628 = auVar5._24_8_;
      uStack_dc8 = uStack_1628;
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      local_760 = local_1420;
      uStack_758 = uStack_1418;
      uStack_750 = uStack_1410;
      uStack_748 = uStack_1408;
      auVar13._8_8_ = uStack_14d8;
      auVar13._0_8_ = local_14e0;
      auVar13._16_8_ = uStack_14d0;
      auVar13._24_8_ = uStack_14c8;
      auVar12._8_8_ = uStack_1418;
      auVar12._0_8_ = local_1420;
      auVar12._16_8_ = uStack_1410;
      auVar12._24_8_ = uStack_1408;
      auVar5 = vpsadbw_avx2(auVar13,auVar12);
      local_7a0 = local_1420;
      uStack_798 = uStack_1418;
      uStack_790 = uStack_1410;
      uStack_788 = uStack_1408;
      auVar11._8_8_ = uStack_1458;
      auVar11._0_8_ = local_1460;
      auVar11._16_8_ = uStack_1450;
      auVar11._24_8_ = uStack_1448;
      auVar10._8_8_ = uStack_1418;
      auVar10._0_8_ = local_1420;
      auVar10._16_8_ = uStack_1410;
      auVar10._24_8_ = uStack_1408;
      auVar6 = vpsadbw_avx2(auVar11,auVar10);
      local_1680 = auVar5._0_8_;
      local_e00 = local_1680;
      uStack_1678 = auVar5._8_8_;
      uStack_df8 = uStack_1678;
      uStack_1670 = auVar5._16_8_;
      uStack_df0 = uStack_1670;
      uStack_1668 = auVar5._24_8_;
      uStack_de8 = uStack_1668;
      local_16a0 = auVar6._0_8_;
      local_e20 = local_16a0;
      uStack_1698 = auVar6._8_8_;
      uStack_e18 = uStack_1698;
      uStack_1690 = auVar6._16_8_;
      uStack_e10 = uStack_1690;
      uStack_1688 = auVar6._24_8_;
      uStack_e08 = uStack_1688;
      auVar5 = vpaddw_avx2(auVar5,auVar6);
      local_e40 = vpslldq_avx2(auVar3,2);
      local_15a0 = auVar2._0_8_;
      local_e60 = local_15a0;
      uStack_1598 = auVar2._8_8_;
      uStack_e58 = uStack_1598;
      uStack_1590 = auVar2._16_8_;
      uStack_e50 = uStack_1590;
      uStack_1588 = auVar2._24_8_;
      uStack_e48 = uStack_1588;
      auVar2 = vpaddw_avx2(local_e40,auVar2);
      local_e80 = vpslldq_avx2(auVar4,4);
      ref_00 = auVar2._8_8_;
      vbuf_00 = auVar2._16_8_;
      uStack_16c8 = auVar2._24_8_;
      uStack_e88 = uStack_16c8;
      _local_1700 = vpaddw_avx2(local_e80,auVar2);
      local_ec0 = vpslldq_avx2(auVar5,6);
      local_ee0 = local_1700;
      uStack_ed8 = uStackY_16f8;
      uStack_ed0 = uStackY_16f0;
      local_1720 = vpaddw_avx2(local_ec0,_local_1700);
      local_8e0 = local_1720._0_8_;
      uStack_8d8 = local_1720._8_8_;
      uStack_8d0 = local_1720._16_8_;
      uStack_8c8 = local_1720._24_8_;
      local_130 = local_1720._0_8_;
      uStack_128 = local_1720._8_8_;
      local_140 = local_1720._16_8_;
      uStack_138 = local_1720._24_8_;
      local_1730 = vpaddw_avx(local_1720._0_16_,local_1720._16_16_);
      local_160 = vpsrldq_avx(local_1730,8);
      local_1740 = vpaddw_avx(local_1730,local_160);
      local_a8 = local_fa8;
      local_60 = local_1740._0_8_;
      uStack_58 = local_1740._8_8_;
      local_c0 = vpsrlw_avx(local_1740,ZEXT416(local_fc0));
      *local_fa8 = local_c0._0_8_;
      local_fa8 = local_fa8 + 1;
      local_fb0 = local_fb0 + (local_fb4 << 2);
      uStack_ec8 = local_1700._24_8_;
      local_ea0 = auVar2._0_8_;
      uStack_e98 = ref_00;
      uStack_e90 = vbuf_00;
      local_150 = local_1730;
    }
  }
  else if (in_ECX == 0x20) {
    local_960 = 0;
    uStack_958 = 0;
    uStack_950 = 0;
    uStack_948 = 0;
    local_1760 = 0;
    uStackY_1758 = 0;
    uStackY_1750 = 0;
    uStackY_1748 = 0;
    for (local_1764 = 0; local_1764 < local_fbc; local_1764 = local_1764 + 4) {
      load_from_src_buf(local_fb0,(__m256i *)&local_1800,local_fb4);
      local_7e0 = local_1760;
      uStack_7d8 = uStackY_1758;
      uStack_7d0 = uStackY_1750;
      uStack_7c8 = uStackY_1748;
      auVar9._8_8_ = lStackY_17f8;
      auVar9._0_8_ = local_1800;
      auVar9._16_8_ = lStackY_17f0;
      auVar9._24_8_ = lStackY_17e8;
      auVar2._8_8_ = uStackY_1758;
      auVar2._0_8_ = local_1760;
      auVar2._16_8_ = uStackY_1750;
      auVar2._24_8_ = uStackY_1748;
      auVar2 = vpsadbw_avx2(auVar9,auVar2);
      local_820 = local_1760;
      uStack_818 = uStackY_1758;
      uStack_810 = uStackY_1750;
      uStack_808 = uStackY_1748;
      auVar8._8_8_ = uStackY_17d8;
      auVar8._0_8_ = local_17e0;
      auVar8._16_8_ = uStackY_17d0;
      auVar8._24_8_ = uStackY_17c8;
      auVar3._8_8_ = uStackY_1758;
      auVar3._0_8_ = local_1760;
      auVar3._16_8_ = uStackY_1750;
      auVar3._24_8_ = uStackY_1748;
      auVar3 = vpsadbw_avx2(auVar8,auVar3);
      local_860 = local_1760;
      uStack_858 = uStackY_1758;
      uStack_850 = uStackY_1750;
      uStack_848 = uStackY_1748;
      auVar7._8_8_ = uStackY_17b8;
      auVar7._0_8_ = local_17c0;
      auVar7._16_8_ = uStackY_17b0;
      auVar7._24_8_ = uStackY_17a8;
      auVar4._8_8_ = uStackY_1758;
      auVar4._0_8_ = local_1760;
      auVar4._16_8_ = uStackY_1750;
      auVar4._24_8_ = uStackY_1748;
      auVar4 = vpsadbw_avx2(auVar7,auVar4);
      local_8a0 = local_1760;
      uStack_898 = uStackY_1758;
      uStack_890 = uStackY_1750;
      uStack_888 = uStackY_1748;
      auVar6._8_8_ = uStackY_1798;
      auVar6._0_8_ = local_17a0;
      auVar6._16_8_ = uStackY_1790;
      auVar6._24_8_ = uStackY_1788;
      auVar5._8_8_ = uStackY_1758;
      auVar5._0_8_ = local_1760;
      auVar5._16_8_ = uStackY_1750;
      auVar5._24_8_ = uStackY_1748;
      auVar5 = vpsadbw_avx2(auVar6,auVar5);
      local_f00 = vpslldq_avx2(auVar3,2);
      local_1820 = auVar2._0_8_;
      local_f20 = local_1820;
      uStackY_1818 = auVar2._8_8_;
      uStack_f18 = uStackY_1818;
      uStackY_1810 = auVar2._16_8_;
      uStack_f10 = uStackY_1810;
      uStackY_1808 = auVar2._24_8_;
      uStack_f08 = uStackY_1808;
      auVar2 = vpaddw_avx2(local_f00,auVar2);
      local_f40 = vpslldq_avx2(auVar4,4);
      local_18a0 = auVar2._0_8_;
      local_f60 = local_18a0;
      uStackY_1898 = auVar2._8_8_;
      uStack_f58 = uStackY_1898;
      uStackY_1890 = auVar2._16_8_;
      uStack_f50 = uStackY_1890;
      uStackY_1888 = auVar2._24_8_;
      uStack_f48 = uStackY_1888;
      auVar2 = vpaddw_avx2(local_f40,auVar2);
      local_f80 = vpslldq_avx2(auVar5,6);
      local_18c0 = auVar2._0_8_;
      local_fa0 = local_18c0;
      uStackY_18b8 = auVar2._8_8_;
      uStack_f98 = uStackY_18b8;
      uStackY_18b0 = auVar2._16_8_;
      uStack_f90 = uStackY_18b0;
      uStackY_18a8 = auVar2._24_8_;
      uStack_f88 = uStackY_18a8;
      auVar2 = vpaddw_avx2(local_f80,auVar2);
      local_18e0 = auVar2._0_8_;
      local_900 = local_18e0;
      uStackY_18d8 = auVar2._8_8_;
      uStack_8f8 = uStackY_18d8;
      uStackY_18d0 = auVar2._16_8_;
      uStack_8f0 = uStackY_18d0;
      uStackY_18c8 = auVar2._24_8_;
      uStack_8e8 = uStackY_18c8;
      local_170 = local_18e0;
      uStack_168 = uStackY_18d8;
      local_180 = uStackY_18d0;
      uStack_178 = uStackY_18c8;
      local_190 = vpaddw_avx(auVar2._0_16_,auVar2._16_16_);
      local_1a0 = vpsrldq_avx(local_190,8);
      auVar1 = vpaddw_avx(local_190,local_1a0);
      local_c8 = local_fa8;
      local_1900 = auVar1._0_8_;
      local_80 = local_1900;
      uStackY_18f8 = auVar1._8_8_;
      uStack_78 = uStackY_18f8;
      local_e0 = vpsrlw_avx(auVar1,ZEXT416(local_fc0));
      *local_fa8 = local_e0._0_8_;
      local_fa8 = local_fa8 + 1;
      local_fb0 = local_fb0 + (local_fb4 << 2);
    }
  }
  else if (in_ECX == 0x10) {
    aom_int_pro_col_16wd_avx2(vbuf_00,ref_00,local_16e0._4_4_,local_16e0._0_4_,local_1700._28_4_);
  }
  return;
}

Assistant:

void aom_int_pro_col_avx2(int16_t *vbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  assert(width % 16 == 0);
  if (width == 128) {
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[16];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);
      load_from_src_buf(ref + 32, &src[4], ref_stride);
      load_from_src_buf(ref + 64, &src[8], ref_stride);
      load_from_src_buf(ref + 96, &src[12], ref_stride);

      // Row0 output: r00 x x x r01 x x x | r02 x x x r03 x x x
      const __m256i s0 = _mm256_add_epi16(_mm256_sad_epu8(src[0], zero),
                                          _mm256_sad_epu8(src[4], zero));
      const __m256i s1 = _mm256_add_epi16(_mm256_sad_epu8(src[8], zero),
                                          _mm256_sad_epu8(src[12], zero));
      const __m256i r0 = _mm256_add_epi16(s0, s1);
      // Row1 output: r10 x x x r11 x x x | r12 x x x r13 x x x
      const __m256i s2 = _mm256_add_epi16(_mm256_sad_epu8(src[1], zero),
                                          _mm256_sad_epu8(src[5], zero));
      const __m256i s3 = _mm256_add_epi16(_mm256_sad_epu8(src[9], zero),
                                          _mm256_sad_epu8(src[13], zero));
      const __m256i r1 = _mm256_add_epi16(s2, s3);
      // Row2 output: r20 x x x r21 x x x | r22 x x x r23 x x x
      const __m256i s4 = _mm256_add_epi16(_mm256_sad_epu8(src[2], zero),
                                          _mm256_sad_epu8(src[6], zero));
      const __m256i s5 = _mm256_add_epi16(_mm256_sad_epu8(src[10], zero),
                                          _mm256_sad_epu8(src[14], zero));
      const __m256i r2 = _mm256_add_epi16(s4, s5);
      // Row3 output: r30 x x x r31 x x x | r32 x x x r33 x x x
      const __m256i s6 = _mm256_add_epi16(_mm256_sad_epu8(src[3], zero),
                                          _mm256_sad_epu8(src[7], zero));
      const __m256i s7 = _mm256_add_epi16(_mm256_sad_epu8(src[11], zero),
                                          _mm256_sad_epu8(src[15], zero));
      const __m256i r3 = _mm256_add_epi16(s6, s7);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 64) {
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[8];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);
      load_from_src_buf(ref + 32, &src[4], ref_stride);

      // Row0 output: r00 x x x r01 x x x | r02 x x x r03 x x x
      const __m256i s0 = _mm256_sad_epu8(src[0], zero);
      const __m256i s1 = _mm256_sad_epu8(src[4], zero);
      const __m256i r0 = _mm256_add_epi16(s0, s1);
      // Row1 output: r10 x x x r11 x x x | r12 x x x r13 x x x
      const __m256i s2 = _mm256_sad_epu8(src[1], zero);
      const __m256i s3 = _mm256_sad_epu8(src[5], zero);
      const __m256i r1 = _mm256_add_epi16(s2, s3);
      // Row2 output: r20 x x x r21 x x x | r22 x x x r23 x x x
      const __m256i s4 = _mm256_sad_epu8(src[2], zero);
      const __m256i s5 = _mm256_sad_epu8(src[6], zero);
      const __m256i r2 = _mm256_add_epi16(s4, s5);
      // Row3 output: r30 x x x r31 x x x | r32 x x x r33 x x x
      const __m256i s6 = _mm256_sad_epu8(src[3], zero);
      const __m256i s7 = _mm256_sad_epu8(src[7], zero);
      const __m256i r3 = _mm256_add_epi16(s6, s7);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 32) {
    assert(height % 2 == 0);
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[4];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);

      // s00 x x x s01 x x x s02 x x x s03 x x x
      const __m256i r0 = _mm256_sad_epu8(src[0], zero);
      // s10 x x x s11 x x x s12 x x x s13 x x x
      const __m256i r1 = _mm256_sad_epu8(src[1], zero);
      // s20 x x x s21 x x x s22 x x x s23 x x x
      const __m256i r2 = _mm256_sad_epu8(src[2], zero);
      // s30 x x x s31 x x x s32 x x x s33 x x x
      const __m256i r3 = _mm256_sad_epu8(src[3], zero);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 16) {
    aom_int_pro_col_16wd_avx2(vbuf, ref, ref_stride, height, norm_factor);
  }
}